

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_model_trainer.cc
# Opt level: O2

Trainer * __thiscall sentencepiece::character::Trainer::Train(Trainer *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  long *plVar3;
  flat_hash_map<unsigned_int,_long> *m;
  Status *_status;
  long *in_RSI;
  uint uVar4;
  float fVar5;
  float local_1d4;
  ulong local_1d0;
  _Vector_base<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
  local_1c8;
  undefined1 local_1b0 [384];
  
  (**(code **)(*in_RSI + 0x20))();
  if ((this->super_TrainerInterface)._vptr_TrainerInterface != (_func_int **)0x0) {
    return this;
  }
  sentencepiece::util::Status::~Status((Status *)this);
  if (*(char *)((long)in_RSI + 0x20a) == '\0') {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"src/char_model_trainer.cc");
    std::operator<<((ostream *)poVar1,"(");
    std::ostream::operator<<(poVar1,0x1b);
    std::operator<<((ostream *)poVar1,") [");
    std::operator<<((ostream *)poVar1,"normalizer_spec_.escape_whitespaces()");
    std::operator<<((ostream *)poVar1,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  else if ((int)in_RSI[0x31] == 4) {
    TrainerInterface::LoadSentences(&this->super_TrainerInterface);
    if ((this->super_TrainerInterface)._vptr_TrainerInterface != (_func_int **)0x0) {
      return this;
    }
    sentencepiece::util::Status::~Status((Status *)this);
    uVar4 = *(int *)((long)in_RSI + 0x18c) - (int)in_RSI[0x51];
    if ((int)uVar4 < 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"src/char_model_trainer.cc");
      std::operator<<((ostream *)poVar1,"(");
      std::ostream::operator<<(poVar1,0x21);
      std::operator<<((ostream *)poVar1,") [");
      std::operator<<((ostream *)poVar1,"(vocab_size) >= (0)");
      std::operator<<((ostream *)poVar1,"] ");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    }
    else {
      plVar3 = in_RSI + 3;
      uVar2 = 0;
      while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
        uVar2 = uVar2 + plVar3[2];
      }
      fVar5 = logf((float)uVar2);
      if (in_RSI[8] == in_RSI[9]) {
        Sorted<unsigned_int,long>
                  ((vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                    *)&local_1c8,(sentencepiece *)(in_RSI + 1),m);
        local_1d0 = (ulong)uVar4;
        while ((local_1c8._M_impl.super__Vector_impl_data._M_start !=
                local_1c8._M_impl.super__Vector_impl_data._M_finish &&
               ((*(char *)((long)in_RSI + 0x171) != '\0' ||
                ((in_RSI[9] - in_RSI[8]) / 0x28 != local_1d0))))) {
          sentencepiece::string_util::UnicodeCharToUTF8_abi_cxx11_
                    ((uint)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b0);
          local_1d4 = logf((float)(local_1c8._M_impl.super__Vector_impl_data._M_start)->second);
          local_1d4 = local_1d4 - fVar5;
          std::
          vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
          ::emplace_back<std::__cxx11::string,float>
                    ((vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
                      *)(in_RSI + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     &local_1d4);
          std::__cxx11::string::~string((string *)local_1b0);
          local_1c8._M_impl.super__Vector_impl_data._M_start =
               local_1c8._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::
        _Vector_base<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
        ::~_Vector_base(&local_1c8);
        if (*(char *)((long)in_RSI + 0x171) == '\x01') {
          *(byte *)((long)in_RSI + 0x9b) = *(byte *)((long)in_RSI + 0x9b) | 2;
          *(int *)((long)in_RSI + 0x18c) = (int)((in_RSI[9] - in_RSI[8]) / 0x28) + (int)in_RSI[0x51]
          ;
        }
        TrainerInterface::Save(&this->super_TrainerInterface);
        return this;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"src/char_model_trainer.cc");
      std::operator<<((ostream *)poVar1,"(");
      std::ostream::operator<<(poVar1,0x2a);
      std::operator<<((ostream *)poVar1,") [");
      std::operator<<((ostream *)poVar1,"final_pieces_.empty()");
      std::operator<<((ostream *)poVar1,"] ");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    }
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"src/char_model_trainer.cc");
    std::operator<<((ostream *)poVar1,"(");
    std::ostream::operator<<(poVar1,0x1c);
    std::operator<<((ostream *)poVar1,") [");
    std::operator<<((ostream *)poVar1,"(TrainerSpec::CHAR) == (trainer_spec_.model_type())");
    std::operator<<((ostream *)poVar1,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return this;
}

Assistant:

util::Status Trainer::Train() {
  RETURN_IF_ERROR(status());

  CHECK_OR_RETURN(normalizer_spec_.escape_whitespaces());
  CHECK_EQ_OR_RETURN(TrainerSpec::CHAR, trainer_spec_.model_type());

  RETURN_IF_ERROR(LoadSentences());

  const int vocab_size = trainer_spec_.vocab_size() - meta_pieces_.size();
  CHECK_GE_OR_RETURN(vocab_size, 0);

  uint64 sum = 0;
  for (const auto &it : required_chars_) {
    sum += it.second;
  }

  const auto logsum = std::log(static_cast<float>(sum));

  CHECK_OR_RETURN(final_pieces_.empty());
  for (const auto &it : Sorted(required_chars_)) {
    if (!trainer_spec_.use_all_vocab() &&
        final_pieces_.size() == static_cast<size_t>(vocab_size)) {
      break;
    }
    final_pieces_.emplace_back(
        string_util::UnicodeCharToUTF8(it.first),
        std::log(static_cast<float>(it.second)) - logsum);
  }

  if (trainer_spec_.use_all_vocab()) {
    trainer_spec_.set_vocab_size(final_pieces_.size() + meta_pieces_.size());
  }

  return Save();
}